

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

void __thiscall
Region_OversizedFile_Test::Region_OversizedFile_Test(Region_OversizedFile_Test *this)

{
  Region_OversizedFile_Test *this_local;
  
  anon_unknown.dwarf_1ca3d2::Region::Region(&this->super_Region);
  (this->super_Region).super_Test._vptr_Test =
       (_func_int **)&PTR__Region_OversizedFile_Test_003d33d0;
  return;
}

Assistant:

TEST_F (Region, OversizedFile) {
    constexpr std::size_t big_region_size = 64;
    constexpr std::size_t small_region_size = 16;
    constexpr std::size_t xxl = 8;
    constexpr std::size_t file_size = big_region_size + small_region_size + xxl;

    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, file_size);

    pstore::region::mem_based_factory factory (file, big_region_size, small_region_size);
    auto result = factory.init ();

    ASSERT_EQ (2U, result.size ()) << "The region factory did not return exactly 2 regions";
    {
        auto const & region0 = *(result.at (0));

        EXPECT_EQ (sp, region0.data ());
        EXPECT_EQ (0U, region0.offset ());
        EXPECT_EQ (big_region_size, region0.size ());
        EXPECT_TRUE (region0.is_writable ()) << "The first region of 0 should not be writable";
    }
    {
        auto const & region1 = *(result.at (1));
        std::uint8_t const * expected = sp.get () + big_region_size;
        void const * actual = region1.data ().get ();

        EXPECT_EQ (expected, actual);
        EXPECT_EQ (big_region_size, region1.offset ());
        EXPECT_EQ (small_region_size * 2, region1.size ());
        EXPECT_TRUE (region1.is_writable ());
    }
}